

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O0

void __thiscall
dynet::Min::forward_dev_impl<dynet::Device_CPU>
          (Min *this,Device_CPU *dev,
          vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_> *xs,Tensor *fx)

{
  vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_> *in_RDX;
  array<long,_1> this_00;
  TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer> TVar1;
  Tensor t;
  DefaultDevice *in_stack_fffffffffffffdf8;
  Tensor *in_stack_fffffffffffffe00;
  Device *in_stack_fffffffffffffe08;
  TensorDevice<Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_Eigen::DefaultDevice>
  *in_stack_fffffffffffffe10;
  Dim *in_stack_fffffffffffffe18;
  Tensor *in_stack_fffffffffffffe20;
  TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_0>
  *in_stack_fffffffffffffe28;
  TensorBase<Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_cmp_op<float,_float,_(Eigen::internal::ComparisonName)1>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>,_0>
  *in_stack_fffffffffffffe48;
  
  Tensor::Tensor(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
                 (float *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
                 (DeviceMempool)((ulong)in_stack_fffffffffffffe00 >> 0x20));
  std::vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>::operator[](in_RDX,0);
  Tensor::tvec(in_stack_fffffffffffffe00);
  std::vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>::operator[](in_RDX,1);
  Tensor::tvec(in_stack_fffffffffffffe00);
  Eigen::TensorBase<Eigen::TensorMap<Eigen::Tensor<float,1,0,long>,0,Eigen::MakePointer>,0>::
  operator<(in_stack_fffffffffffffe28,
            (TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer> *)
            in_stack_fffffffffffffe20);
  Eigen::
  TensorBase<Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_cmp_op<float,_float,_(Eigen::internal::ComparisonName)1>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>,_0>
  ::cast<float>(in_stack_fffffffffffffe48);
  Tensor::tvec(in_stack_fffffffffffffe00);
  Eigen::TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_1>::
  device<Eigen::DefaultDevice>
            ((TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_1>
              *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  Eigen::
  TensorDevice<Eigen::TensorMap<Eigen::Tensor<float,1,0,long>,0,Eigen::MakePointer>,Eigen::DefaultDevice>
  ::operator=(in_stack_fffffffffffffe10,
              (TensorConversionOp<float,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_cmp_op<float,_float,_(Eigen::internal::ComparisonName)1>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>_>
               *)in_stack_fffffffffffffe08);
  std::vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>::operator[](in_RDX,0);
  TVar1 = Tensor::tvec(in_stack_fffffffffffffe00);
  this_00._M_elems[0] = (_Type)TVar1.m_dimensions.super_array<long,_1>._M_elems[0];
  std::vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>::operator[](in_RDX,1);
  TVar1 = Tensor::tvec(in_stack_fffffffffffffe00);
  Eigen::TensorBase<Eigen::TensorMap<Eigen::Tensor<float,1,0,long>,0,Eigen::MakePointer>,0>::
  cwiseMin<0,Eigen::TensorMap<Eigen::Tensor<float,1,0,long>,0,Eigen::MakePointer>>
            ((TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_0>
              *)this_00._M_elems[0],
             (TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer> *)TVar1.m_data);
  TVar1 = Tensor::tvec(in_stack_fffffffffffffe00);
  Eigen::TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_1>::
  device<Eigen::DefaultDevice>
            ((TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_1>
              *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  Eigen::
  TensorDevice<Eigen::TensorMap<Eigen::Tensor<float,1,0,long>,0,Eigen::MakePointer>,Eigen::DefaultDevice>
  ::operator=((TensorDevice<Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_Eigen::DefaultDevice>
               *)TVar1.m_data,
              (TensorCwiseBinaryOp<Eigen::internal::scalar_min_op<float,_float,_0>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>
               *)TVar1.m_dimensions.super_array<long,_1>._M_elems[0].super_array<long,_1>);
  Tensor::~Tensor((Tensor *)0xa1ef3c);
  return;
}

Assistant:

void Min::forward_dev_impl(const MyDevice & dev, const vector<const Tensor*>& xs, Tensor& fx) const {
  Tensor t(fx.d, static_cast<float*>(aux_mem), fx.device, DeviceMempool::FXS);
  t.tvec().device(*dev.edevice) = (xs[0]->tvec() < xs[1]->tvec()).cast<float>();
  fx.tvec().device(*dev.edevice) = xs[0]->tvec().cwiseMin(xs[1]->tvec());
}